

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O2

int Ssw_ManSweepDyn(Ssw_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int f;
  int iVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Aig_Man_t *pAVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  abctime aVar10;
  void **ppvVar11;
  long lVar12;
  Vec_Ptr_t *pVVar13;
  Bar_Progress_t *p_00;
  Ssw_Sat_t *pSVar14;
  ulong uVar15;
  int nWords;
  Aig_Obj_t *p1;
  Aig_Obj_t *in_RSI;
  Aig_Obj_t *pAVar16;
  uint uVar17;
  
  aVar6 = Abc_Clock();
  pAVar7 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar7;
  Aig_ManFanoutStart(pAVar7);
  p->nSRMiterMaxId = p->pFrames->vObjs->nSize;
  f = p->pPars->nFramesK;
  p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + f] = p->pFrames->pConst1;
  for (uVar17 = 0; (int)uVar17 < p->pAig->nTruePis; uVar17 = uVar17 + 1) {
    in_RSI = (Aig_Obj_t *)(ulong)uVar17;
    pvVar8 = Vec_PtrEntry(p->pAig->vCis,uVar17);
    pAVar9 = Aig_ObjCreateCi(p->pFrames);
    p->pNodeToFrames[*(int *)((long)pvVar8 + 0x24) * p->nFrames + f] = pAVar9;
  }
  Aig_ManSetCioIds(p->pFrames);
  Ssw_ManLabelPiNodes(p);
  aVar10 = Abc_Clock();
  p->timeReduce = p->timeReduce + (aVar10 - aVar6);
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x18e,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
  }
  uVar17 = p->pFrames->nObjs[2];
  ppvVar11 = (void **)malloc((long)(int)uVar17 * 0xc);
  lVar12 = 0;
  uVar15 = 0;
  if (0 < (int)uVar17) {
    uVar15 = (ulong)uVar17;
  }
  for (; uVar15 * 4 != lVar12; lVar12 = lVar12 + 4) {
    in_RSI = (Aig_Obj_t *)((long)ppvVar11 + lVar12 + (long)(int)uVar17 * 8);
    *(Aig_Obj_t **)((long)ppvVar11 + lVar12 * 2) = in_RSI;
  }
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  pVVar13->nSize = uVar17;
  pVVar13->nCap = uVar17;
  pVVar13->pArray = ppvVar11;
  p->vSimInfo = pVVar13;
  Vec_PtrCleanSimInfo(pVVar13,(int)in_RSI,nWords);
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  uVar17 = 0;
  if (p->pPars->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    uVar5 = p->pAig->vObjs->nSize;
    in_RSI = (Aig_Obj_t *)(ulong)uVar5;
    p_00 = Bar_ProgressStart(_stdout,uVar5);
  }
  p->iNodeStart = 0;
  do {
    pVVar13 = p->pAig->vObjs;
    if (pVVar13->nSize <= (int)uVar17) {
      if (0 < p->nPatterns) {
        p->iNodeLast = uVar17;
        if (p->pPars->fLocalSim == 0) {
          Ssw_ManSweepResimulateDyn(p,(int)in_RSI);
        }
        else {
          Ssw_ManSweepResimulateDynLocal(p,(int)in_RSI);
        }
      }
      if (p->pPars->fVerbose != 0) {
        Bar_ProgressStop(p_00);
      }
      return p->fRefined;
    }
    in_RSI = (Aig_Obj_t *)(ulong)uVar17;
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pVVar13,uVar17);
    if (pAVar9 != (Aig_Obj_t *)0x0) {
      if (p->iNodeStart == 0) {
        p->iNodeStart = uVar17;
      }
      if ((p->pPars->fVerbose != 0) &&
         ((p_00 == (Bar_Progress_t *)0x0 || (p_00->nItemsNext <= (int)uVar17)))) {
        in_RSI = (Aig_Obj_t *)(ulong)uVar17;
        Bar_ProgressUpdate_int(p_00,uVar17,(char *)0x0);
      }
      uVar5 = (uint)*(undefined8 *)&pAVar9->field_0x18;
      if ((uVar5 & 7) == 2) {
        pAVar7 = p->pAig;
        iVar4 = Aig_ObjCioId(pAVar9);
        if (iVar4 < pAVar7->nTruePis) {
          uVar5 = (uint)*(undefined8 *)&pAVar9->field_0x18;
          goto LAB_0050c33c;
        }
LAB_0050c3c4:
        uVar5 = Ssw_ManSweepNode(p,pAVar9,f,0,(Vec_Int_t *)0x0);
        p->fRefined = p->fRefined | uVar5;
        in_RSI = pAVar9;
      }
      else {
LAB_0050c33c:
        if (0xfffffffd < (uVar5 & 7) - 7) {
          if (((ulong)pAVar9 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar15 = (ulong)pAVar9->pFanin0 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            pAVar16 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar16 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar9->pFanin0 & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar15 + 0x24) * p->nFrames + f]);
          }
          uVar15 = (ulong)pAVar9->pFanin1 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar9->pFanin1 & 1) ^
                 (ulong)p->pNodeToFrames[*(int *)(uVar15 + 0x24) * p->nFrames + f]);
          }
          pAVar16 = Aig_And(p->pFrames,pAVar16,p1);
          p->pNodeToFrames[pAVar9->Id * p->nFrames + f] = pAVar16;
          goto LAB_0050c3c4;
        }
      }
      iVar4 = (int)in_RSI;
      if (p->pMSat->pSat != (sat_solver *)0x0) {
        iVar3 = p->pPars->nSatVarMax2;
        if (((iVar3 == 0) || (p->pMSat->nSatVars <= iVar3)) ||
           (p->nRecycleCalls <= p->pPars->nRecycleCalls2)) {
          if (p->nPatterns == 0x20) {
            p->iNodeLast = uVar17;
            if (p->pPars->fLocalSim == 0) {
              Ssw_ManSweepResimulateDyn(p,iVar4);
            }
            else {
              Ssw_ManSweepResimulateDynLocal(p,iVar4);
            }
            p->iNodeStart = uVar17 + 1;
          }
          goto LAB_0050c4d1;
        }
      }
      if (0 < p->nPatterns) {
        p->iNodeLast = uVar17;
        if (p->pPars->fLocalSim == 0) {
          Ssw_ManSweepResimulateDyn(p,iVar4);
        }
        else {
          Ssw_ManSweepResimulateDynLocal(p,iVar4);
        }
        p->iNodeStart = uVar17 + 1;
      }
      Aig_ManCleanMarkAB(p->pFrames);
      Ssw_ManLabelPiNodes(p);
      pSVar14 = p->pMSat;
      if (pSVar14 != (Ssw_Sat_t *)0x0) {
        iVar4 = pSVar14->nSatVars;
        if (pSVar14->nSatVars < p->nVarsMax) {
          iVar4 = p->nVarsMax;
        }
        p->nVarsMax = iVar4;
        iVar4 = pSVar14->nSolverCalls;
        if (pSVar14->nSolverCalls < p->nCallsMax) {
          iVar4 = p->nCallsMax;
        }
        p->nCallsMax = iVar4;
        Ssw_SatStop(pSVar14);
        uVar1 = p->nRecycles;
        uVar2 = p->nRecyclesTotal;
        p->nRecycles = uVar1 + 1;
        p->nRecyclesTotal = uVar2 + 1;
        p->nRecycleCalls = 0;
      }
      pSVar14 = Ssw_SatStart(0);
      p->pMSat = pSVar14;
      if (p->nPatterns != 0) {
        __assert_fail("p->nPatterns == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                      ,0x1c7,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
      }
    }
LAB_0050c4d1:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepDyn( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, f;
    abctime clk;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    Aig_ManFanoutStart( p->pFrames );
    p->nSRMiterMaxId = Aig_ManObjNumMax( p->pFrames );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
    Aig_ManSetCioIds( p->pFrames );
    // label nodes corresponding to primary inputs
    Ssw_ManLabelPiNodes( p );
p->timeReduce += Abc_Clock() - clk;

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    p->iNodeStart = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->iNodeStart == 0 )
            p->iNodeStart = i;
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        }
        // check if it is time to recycle the solver
        if ( p->pMSat->pSat == NULL ||
            (p->pPars->nSatVarMax2 &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax2 &&
             p->nRecycleCalls > p->pPars->nRecycleCalls2) )
        {
            // resimulate
            if ( p->nPatterns > 0 )
            {
                p->iNodeLast = i;
                if ( p->pPars->fLocalSim )
                    Ssw_ManSweepResimulateDynLocal( p, f );
                else
                    Ssw_ManSweepResimulateDyn( p, f );
                p->iNodeStart = i+1;
            }
//                Abc_Print( 1, "Recycling SAT solver with %d vars and %d calls.\n", 
//                    p->pMSat->nSatVars, p->nRecycleCalls );
//            Aig_ManCleanMarkAB( p->pAig );
            Aig_ManCleanMarkAB( p->pFrames );
            // label nodes corresponding to primary inputs
            Ssw_ManLabelPiNodes( p );
            // replace the solver
            if ( p->pMSat )
            {
                p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
                p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
                Ssw_SatStop( p->pMSat );
                p->nRecycles++;
                p->nRecyclesTotal++;
                p->nRecycleCalls = 0;
            }
            p->pMSat = Ssw_SatStart( 0 );
            assert( p->nPatterns == 0 );
        }
        // resimulate
        if ( p->nPatterns == 32 )
        {
            p->iNodeLast = i;
            if ( p->pPars->fLocalSim )
                Ssw_ManSweepResimulateDynLocal( p, f );
            else
                Ssw_ManSweepResimulateDyn( p, f );
            p->iNodeStart = i+1;
        }
    }
    // resimulate
    if ( p->nPatterns > 0 )
    {
        p->iNodeLast = i;
        if ( p->pPars->fLocalSim )
            Ssw_ManSweepResimulateDynLocal( p, f );
        else
            Ssw_ManSweepResimulateDyn( p, f );
    }
    // collect stats
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}